

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block
          (CompilerMSL *this,string *ib_var_ref,SPIRType *ib_type,SPIRVariable *var)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  TypedID<(spirv_cross::Types)1> TVar4;
  SPIREntryPoint *pSVar5;
  size_t sVar6;
  SPIRType *pSVar7;
  mapped_type *pmVar8;
  Bitset *pBVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  uint32_t local_264;
  uint32_t local_260;
  uint32_t local_25c;
  uint32_t locn_3;
  uint32_t local_254;
  uint32_t local_250;
  uint32_t local_24c;
  uint32_t locn_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [8];
  string qual_var_name;
  undefined1 local_200 [8];
  string mbr_name_1;
  TypedID<(spirv_cross::Types)1> local_1dc;
  TypedID<(spirv_cross::Types)1> local_1d8;
  TypedID<(spirv_cross::Types)1> local_1d4;
  SPIRType *local_1d0;
  SPIRType *new_var_type;
  uint32_t local_1c0;
  uint32_t ptr_type_id;
  uint32_t type_id_1;
  uint32_t ib_mbr_idx_1;
  CompilerMSL *local_1b0;
  string local_1a8 [32];
  string local_188 [32];
  function<void_()> local_168;
  anon_class_80_4_4974f528 local_148;
  function<void_()> local_f8;
  uint32_t local_d4;
  uint32_t local_d0;
  uint32_t local_cc;
  uint32_t local_c8;
  uint32_t locn_1;
  uint32_t local_c0;
  uint32_t local_bc;
  uint32_t local_b8;
  uint32_t locn;
  TypedID<(spirv_cross::Types)1> local_b0;
  uint32_t local_ac;
  uint32_t local_a8;
  uint32_t type_id;
  uint32_t ib_mbr_idx;
  string mbr_name;
  uint32_t local_7c;
  uint32_t local_78;
  string local_68 [36];
  ID local_44;
  uint32_t local_40;
  uint32_t local_3c;
  SPIRType *pSStack_38;
  BuiltIn builtin;
  SPIRType *var_type;
  SPIRFunction *entry_func;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local = (string *)this;
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  var_type = (SPIRType *)Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar3);
  pSStack_38 = Compiler::get_variable_element_type((Compiler *)this,(SPIRVariable *)entry_func);
  local_40 = (entry_func->super_IVariant).self.id;
  local_3c = Compiler::get_decoration((Compiler *)this,(ID)local_40,DecorationBuiltIn);
  local_44.id = (entry_func->super_IVariant).self.id;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_68,this,(ulong)local_3c);
  Compiler::set_name((Compiler *)this,local_44,local_68);
  ::std::__cxx11::string::~string((string *)local_68);
  pSVar5 = Compiler::get_entry_point((Compiler *)this);
  bVar2 = Bitset::get(&pSVar5->flags,0x16);
  pSVar7 = var_type;
  if (bVar2) {
    local_78 = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    SPIRFunction::add_local_variable((SPIRFunction *)pSVar7,(VariableID)local_78);
    local_7c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(entry_func->super_IVariant).self)
    ;
    SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,&local_7c);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&ib_mbr_idx,"gl_TessLevel",(allocator *)((long)&type_id + 3));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&type_id + 3));
    if ((this->added_builtin_tess_level & 1U) == 0) {
      sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         ((var_local->dependees).stack_storage.aligned_char + 0x10));
      local_a8 = (uint32_t)sVar6;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_38->super_IVariant).self);
      local_ac = build_extended_vector_type(this,uVar3,4,Unknown);
      pSVar1 = &var_local->dependees;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_b0,local_ac);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                 ((pSVar1->stack_storage).aligned_char + 0x10),&local_b0);
      locn = (uint32_t)
             TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_name((Compiler *)this,(TypeID)locn,local_a8,(string *)&ib_mbr_idx);
      local_b8 = (entry_func->super_IVariant).self.id;
      pBVar9 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_b8);
      bVar2 = Bitset::get(pBVar9,0x1e);
      if (bVar2) {
        local_c0 = (entry_func->super_IVariant).self.id;
        local_bc = Compiler::get_decoration((Compiler *)this,(ID)local_c0,DecorationLocation);
        locn_1 = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)locn_1,local_a8,DecorationLocation,local_bc);
        mark_location_as_used_by_shader(this,local_bc,pSStack_38,StorageClassInput);
      }
      else {
        local_c8 = local_3c;
        sVar10 = ::std::
                 unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
                 ::count(&this->inputs_by_builtin,&local_c8);
        if (sVar10 != 0) {
          local_d0 = local_3c;
          pmVar11 = ::std::
                    unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
                    ::operator[](&this->inputs_by_builtin,&local_d0);
          local_cc = pmVar11->location;
          local_d4 = (uint32_t)
                     TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self)
          ;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)local_d4,local_a8,DecorationLocation,local_cc);
          mark_location_as_used_by_shader(this,local_cc,pSStack_38,StorageClassInput);
        }
      }
      this->added_builtin_tess_level = true;
    }
    if (local_3c == 0xb) {
      pSVar7 = var_type + 2;
      local_148.var = (SPIRVariable *)entry_func;
      local_148.this = this;
      ::std::__cxx11::string::string((string *)&local_148.ib_var_ref,(string *)ib_type_local);
      ::std::__cxx11::string::string((string *)&local_148.mbr_name,(string *)&ib_mbr_idx);
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block(std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&)::__0,void>
                ((function<void()> *)&local_f8,&local_148);
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)&pSVar7->array,&local_f8);
      ::std::function<void_()>::~function(&local_f8);
      add_tess_level_input_to_interface_block(std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&)
      ::$_0::~__0((__0 *)&local_148);
    }
    else {
      if (local_3c != 0xc) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x98c,
                      "void spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block(const std::string &, SPIRType &, SPIRVariable &)"
                     );
      }
      pSVar7 = var_type + 2;
      _type_id_1 = entry_func;
      local_1b0 = this;
      ::std::__cxx11::string::string(local_1a8,(string *)ib_type_local);
      ::std::__cxx11::string::string(local_188,(string *)&ib_mbr_idx);
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block(std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&)::__1,void>
                ((function<void()> *)&local_168,(anon_class_80_4_4974f528 *)&type_id_1);
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)&pSVar7->array,&local_168);
      ::std::function<void_()>::~function(&local_168);
      add_tess_level_input_to_interface_block(std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&)
      ::$_1::~__1((__1 *)&type_id_1);
    }
    ::std::__cxx11::string::~string((string *)&ib_mbr_idx);
  }
  else {
    sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((var_local->dependees).stack_storage.aligned_char + 0x10));
    ptr_type_id = (uint32_t)sVar6;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_38->super_IVariant).self);
    local_1c0 = build_extended_vector_type
                          (this,uVar3,(local_3c == 0xb) + 2 + (uint)(local_3c == 0xb),Unknown);
    uVar3 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    new_var_type._4_4_ = uVar3;
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_1c0);
    local_1d0 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                          ((Compiler *)this,uVar3,pSVar7);
    local_1d0->pointer = true;
    local_1d0->storage = StorageClassInput;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_1d4,local_1c0);
    (local_1d0->parent_type).id = local_1d4.id;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_1d8,new_var_type._4_4_);
    *(uint32_t *)&(entry_func->super_IVariant).field_0xc = local_1d8.id;
    pSVar1 = &var_local->dependees;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_1dc,local_1c0);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
               ((pSVar1->stack_storage).aligned_char + 0x10),&local_1dc);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(entry_func->super_IVariant).self);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_200,(uint32_t)this,SUB41(uVar3,0));
    TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name((Compiler *)this,(TypeID)TVar4.id,ptr_type_id,(string *)local_200);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locn_2,
                     (char *)ib_type_local);
    ::std::operator+(local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locn_2);
    ::std::__cxx11::string::~string((string *)&locn_2);
    pmVar8 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                          &(entry_func->super_IVariant).self);
    ::std::__cxx11::string::operator=
              ((string *)&(pmVar8->decoration).qualified_alias,(string *)local_228);
    local_24c = (entry_func->super_IVariant).self.id;
    pBVar9 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_24c);
    bVar2 = Bitset::get(pBVar9,0x1e);
    if (bVar2) {
      local_254 = (entry_func->super_IVariant).self.id;
      local_250 = Compiler::get_decoration((Compiler *)this,(ID)local_254,DecorationLocation);
      locn_3 = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)locn_3,ptr_type_id,DecorationLocation,local_250);
      mark_location_as_used_by_shader(this,local_250,local_1d0,StorageClassInput);
    }
    else {
      local_25c = local_3c;
      sVar10 = ::std::
               unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
               ::count(&this->inputs_by_builtin,&local_25c);
      if (sVar10 != 0) {
        local_264 = local_3c;
        pmVar11 = ::std::
                  unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
                  ::operator[](&this->inputs_by_builtin,&local_264);
        local_260 = pmVar11->location;
        TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)TVar4.id,ptr_type_id,DecorationLocation,local_260);
        mark_location_as_used_by_shader(this,local_260,local_1d0,StorageClassInput);
      }
    }
    ::std::__cxx11::string::~string((string *)local_228);
    ::std::__cxx11::string::~string((string *)local_200);
  }
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input_to_interface_block(const std::string &ib_var_ref, SPIRType &ib_type,
                                                          SPIRVariable &var)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = get_variable_element_type(var);

	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

	// Force the variable to have the proper name.
	set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	if (get_entry_point().flags.get(ExecutionModeTriangles))
	{
		// Triangles are tricky, because we want only one member in the struct.

		// We need to declare the variable early and at entry-point scope.
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		string mbr_name = "gl_TessLevel";

		// If we already added the other one, we can skip this step.
		if (!added_builtin_tess_level)
		{
			// Add a reference to the variable type to the interface struct.
			uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

			uint32_t type_id = build_extended_vector_type(var_type.self, 4);

			ib_type.member_types.push_back(type_id);

			// Give the member a name
			set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

			// There is no qualified alias since we need to flatten the internal array on return.
			if (get_decoration_bitset(var.self).get(DecorationLocation))
			{
				uint32_t locn = get_decoration(var.self, DecorationLocation);
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
				mark_location_as_used_by_shader(locn, var_type, StorageClassInput);
			}
			else if (inputs_by_builtin.count(builtin))
			{
				uint32_t locn = inputs_by_builtin[builtin].location;
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
				mark_location_as_used_by_shader(locn, var_type, StorageClassInput);
			}

			added_builtin_tess_level = true;
		}

		switch (builtin)
		{
		case BuiltInTessLevelOuter:
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				statement(to_name(var.self), "[0] = ", ib_var_ref, ".", mbr_name, ".x;");
				statement(to_name(var.self), "[1] = ", ib_var_ref, ".", mbr_name, ".y;");
				statement(to_name(var.self), "[2] = ", ib_var_ref, ".", mbr_name, ".z;");
			});
			break;

		case BuiltInTessLevelInner:
			entry_func.fixup_hooks_in.push_back(
			    [=, &var]() { statement(to_name(var.self), "[0] = ", ib_var_ref, ".", mbr_name, ".w;"); });
			break;

		default:
			assert(false);
			break;
		}
	}
	else
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t type_id = build_extended_vector_type(var_type.self, builtin == BuiltInTessLevelOuter ? 4 : 2);
		// Change the type of the variable, too.
		uint32_t ptr_type_id = ir.increase_bound_by(1);
		auto &new_var_type = set<SPIRType>(ptr_type_id, get<SPIRType>(type_id));
		new_var_type.pointer = true;
		new_var_type.storage = StorageClassInput;
		new_var_type.parent_type = type_id;
		var.basetype = ptr_type_id;

		ib_type.member_types.push_back(type_id);

		// Give the member a name
		string mbr_name = to_expression(var.self);
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// Since vectors can be indexed like arrays, there is no need to unpack this. We can
		// just refer to the vector directly. So give it a qualified alias.
		string qual_var_name = ib_var_ref + "." + mbr_name;
		ir.meta[var.self].decoration.qualified_alias = qual_var_name;

		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
		else if (inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
	}
}